

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

int set_param_velocity(void)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  if (g_param.device_version < 7) {
    bVar5 = (g_P_changed[4][0] != 0 || g_P_changed[1][0] != 0) || g_P_changed[9][0] != 0;
    dVar7 = (g_P[1][0] * 1608.495438637974) / (ABS(g_P[9][0]) * g_P[4][0]);
    if ((bVar5) || (g_P_changed[0x30][0] != 0)) {
      uVar2 = 0;
      yprintf(OUTPUT_LV_DEBUG,"Info: GAIN_A: %d\n",(ulong)(uint)(int)(g_P[0x30][0] * dVar7));
      if ((int)(g_P[0x30][0] * dVar7) == 0) {
        yprintf(OUTPUT_LV_ERROR,"ERROR: GAIN_A fixed point value underflow\n");
        goto LAB_0010df15;
      }
      parameter_set('\b','\0',(long)(g_P[0x30][0] * dVar7));
    }
    bVar4 = ~bVar5;
    if (!(bool)(bVar4 & g_P_changed[0x32][0] == 0)) {
      parameter_set('\n','\0',(long)(g_P[0x32][0] * dVar7));
    }
    if (!(bool)(bVar4 & g_P_changed[0x34][0] == 0)) {
      parameter_set('\f','\0',(long)(dVar7 * g_P[0x34][0]));
    }
    bVar5 = (g_P_changed[4][1] != 0 || g_P_changed[1][1] != 0) || g_P_changed[9][1] != 0;
    dVar7 = (g_P[1][1] * 1608.495438637974) / (ABS(g_P[9][1]) * g_P[4][1]);
    if ((bVar5) || (g_P_changed[0x31][0] != 0)) {
      yprintf(OUTPUT_LV_DEBUG,"Info: GAIN_B: %d\n",(ulong)(uint)(int)(g_P[0x30][0] * dVar7));
      if ((int)(g_P[0x31][0] * dVar7) == 0) {
        yprintf(OUTPUT_LV_ERROR,"ERROR: GAIN_B fixed point value underflow\n");
        uVar2 = 1;
LAB_0010df15:
        yprintf(OUTPUT_LV_ERROR,"ERROR: Decrease TORQUE_FINENESS[%d]\n",uVar2);
        return 0;
      }
      parameter_set('\t','\0',(long)(g_P[0x31][0] * dVar7));
    }
    bVar4 = ~bVar5;
    if (!(bool)(bVar4 & g_P_changed[0x33][0] == 0)) {
      parameter_set('\v','\0',(long)(g_P[0x33][0] * dVar7));
    }
    if (!(bool)(bVar4 & g_P_changed[0x35][0] == 0)) {
      parameter_set('\r','\0',(long)(dVar7 * g_P[0x35][0]));
    }
  }
  lVar3 = -0x10;
  do {
    if (lVar3 == 0) {
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        if (g_param.motor_enable[lVar3] != 0) {
          parameter_set('A',(char)lVar3,(long)(g_P[0x46][lVar3] * 1000.0));
        }
      }
      return 1;
    }
    if (g_param.motor_enable[lVar3 + 0x10] != 0) {
      cVar1 = (char)lVar3;
      if (6 < g_param.device_version) {
        if (((g_P_changed[2][lVar3] == 0) && (g_P_changed[5][lVar3] == 0)) &&
           (g_P_changed[10][lVar3] == 0)) {
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
        dVar7 = (g_P[2][lVar3] * 1608.495438637974) / (ABS(g_P[10][lVar3]) * g_P[5][lVar3]);
        if ((bVar5) || (g_P_changed[0x3e][lVar3] != 0)) {
          yprintf(OUTPUT_LV_DEBUG,"Info: INERTIA_SELF[%d]: %d\n",(ulong)((int)lVar3 + 0x10),
                  (ulong)(uint)(int)(g_P[0x3e][lVar3] * dVar7));
          dVar6 = g_P[0x3e][lVar3] * dVar7;
          if ((int)dVar6 == 0) {
            uVar2 = (ulong)((int)lVar3 + 0x10);
            yprintf(OUTPUT_LV_ERROR,"ERROR: INERTIA_SELF[%d] fixed point value underflow\n",uVar2);
            goto LAB_0010df15;
          }
          parameter_set('\x1b',cVar1 + '\x10',(long)dVar6);
        }
        if (!(bool)(~bVar5 & g_P_changed[0x3f][lVar3] == 0)) {
          parameter_set('\x1c',cVar1 + '\x10',(long)(dVar7 * g_P[0x3f][lVar3]));
        }
      }
      if (g_P_changed[0x1f][lVar3] != 0) {
        parameter_set('\x0e',cVar1 + '\x10',(long)g_P[0x1f][lVar3]);
      }
      if (g_P_changed[0x20][lVar3] != 0) {
        parameter_set('\x0f',cVar1 + '\x10',(long)g_P[0x20][lVar3]);
      }
      if (((g_P_changed[0x26][lVar3] != 0) || (g_P_changed[5][lVar3] != 0)) ||
         (g_P_changed[10][lVar3] != 0)) {
        parameter_set('\x14',cVar1 + '\x10',
                      (long)(ABS(g_P[10][lVar3]) * g_P[0x26][lVar3] * g_P[5][lVar3]));
        parameter_set('\x15',cVar1 + '\x10',
                      (long)(ABS(g_P[10][lVar3]) * -g_P[0x26][lVar3] * g_P[5][lVar3]));
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int set_param_velocity(void)
{
  int j;

  if (g_param.device_version <= 6)
  {
    double ffr, ffl;
    int ffr_changed = 0, ffl_changed = 0;

    // Feed-forward dynamics compensation parameter
    // (torque [Nm]) = (wheel acc [rad/(s*s)]) * (wheel inertia [kgf*m*m])
    // (torque [toqcnt])
    //    = (wheel acc [cnt/(s*s)) * (TORQUE_UNIT [toqcnt/Nm] * (wheel inertia [kgf*m*m]) * (2 * pi) / ((COUNT_REV [cnt]) * (GEAR))
    // (acc-torque factor [toqcnt/(cnt/(s*s))])
    //    = (TORQUE_UNIT [toqcnt/Nm]) * (wheel inertia [kgf*m*m]) * (2 * pi) / ((COUNT_REV [cnt]) * (GEAR))

    if (ischanged_p(YP_PARAM_TORQUE_UNIT, 0) ||
        ischanged_p(YP_PARAM_COUNT_REV, 0) ||
        ischanged_p(YP_PARAM_GEAR, 0))
    {
      ffr_changed = 1;
    }
    ffr = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][0] / (g_P[YP_PARAM_COUNT_REV][0] * fabs(g_P[YP_PARAM_GEAR][0]));
    if (ischanged_p(YP_PARAM_GAIN_A, 0) || ffr_changed)
    {
      yprintf(OUTPUT_LV_DEBUG, "Info: GAIN_A: %d\n",
              (int)(g_P[YP_PARAM_GAIN_A][0] * ffr));
      if (abs(g_P[YP_PARAM_GAIN_A][0] * ffr) == 0)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: GAIN_A fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", 0);
        return 0;
      }
      parameter_set(PARAM_p_A, 0, g_P[YP_PARAM_GAIN_A][0] * ffr);
    }
    if (ischanged_p(YP_PARAM_GAIN_C, 0) || ffr_changed)
      parameter_set(PARAM_p_C, 0, g_P[YP_PARAM_GAIN_C][0] * ffr);
    if (ischanged_p(YP_PARAM_GAIN_E, 0) || ffr_changed)
      parameter_set(PARAM_p_E, 0, g_P[YP_PARAM_GAIN_E][0] * ffr);

    if (ischanged_p(YP_PARAM_TORQUE_UNIT, 1) ||
        ischanged_p(YP_PARAM_COUNT_REV, 1) ||
        ischanged_p(YP_PARAM_GEAR, 1))
    {
      ffl_changed = 1;
    }
    ffl = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][1] / (g_P[YP_PARAM_COUNT_REV][1] * fabs(g_P[YP_PARAM_GEAR][1]));
    if (ischanged_p(YP_PARAM_GAIN_B, 0) || ffl_changed)
    {
      yprintf(OUTPUT_LV_DEBUG, "Info: GAIN_B: %d\n",
              (int)(g_P[YP_PARAM_GAIN_A][0] * ffl));
      if (abs(g_P[YP_PARAM_GAIN_B][0] * ffl) == 0)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: GAIN_B fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", 1);
        return 0;
      }
      parameter_set(PARAM_p_B, 0, g_P[YP_PARAM_GAIN_B][0] * ffl);
    }
    if (ischanged_p(YP_PARAM_GAIN_D, 0) || ffl_changed)
      parameter_set(PARAM_p_D, 0, g_P[YP_PARAM_GAIN_D][0] * ffl);
    if (ischanged_p(YP_PARAM_GAIN_F, 0) || ffl_changed)
      parameter_set(PARAM_p_F, 0, g_P[YP_PARAM_GAIN_F][0] * ffl);
  }
  // PI制御のパラメータ
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    if (g_param.device_version > 6)
    {
      int ff_changed = 0;
      double ff = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][j] /
                  (g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
      if (ischanged_p(YP_PARAM_TORQUE_UNIT, j) ||
          ischanged_p(YP_PARAM_COUNT_REV, j) ||
          ischanged_p(YP_PARAM_GEAR, j))
      {
        ff_changed = 1;
      }
      if (ischanged_p(YP_PARAM_INERTIA_SELF, j) || ff_changed)
      {
        yprintf(OUTPUT_LV_DEBUG, "Info: INERTIA_SELF[%d]: %d\n", j,
                (int)(g_P[YP_PARAM_INERTIA_SELF][j] * ff));
        if (abs(g_P[YP_PARAM_INERTIA_SELF][j] * ff) == 0)
        {
          yprintf(OUTPUT_LV_ERROR, "ERROR: INERTIA_SELF[%d] fixed point value underflow\n", j);
          yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", j);
          return 0;
        }
        parameter_set(PARAM_p_inertia_self, j, g_P[YP_PARAM_INERTIA_SELF][j] * ff);
      }
      if (ischanged_p(YP_PARAM_INERTIA_CROSS, j) || ff_changed)
      {
        parameter_set(PARAM_p_inertia_cross, j, g_P[YP_PARAM_INERTIA_CROSS][j] * ff);
      }
    }

    // [1/s]
    if (ischanged_p(YP_PARAM_GAIN_KP, j))
      parameter_set(PARAM_p_pi_kp, j, g_P[YP_PARAM_GAIN_KP][j]);
    // [1/s^2]
    if (ischanged_p(YP_PARAM_GAIN_KI, j))
      parameter_set(PARAM_p_pi_ki, j, g_P[YP_PARAM_GAIN_KI][j]);
    // 各種制限
    if (ischanged_p(YP_PARAM_INTEGRAL_MAX, j) ||
        ischanged_p(YP_PARAM_COUNT_REV, j) ||
        ischanged_p(YP_PARAM_GEAR, j))
    {
      parameter_set(PARAM_int_max, j,
                    g_P[YP_PARAM_INTEGRAL_MAX][j] * g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
      parameter_set(PARAM_int_min, j,
                    -g_P[YP_PARAM_INTEGRAL_MAX][j] * g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
    }
  }

  // ウォッチドックタイマの設定
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;
    // [s] -> [ms]
    parameter_set(PARAM_watch_dog_limit, j, g_P[YP_PARAM_DEVICE_TIMEOUT][j] * 1000);
  }
  return 1;
}